

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  error_handler *peVar1;
  error_handler eVar2;
  type tVar3;
  int iVar4;
  error_handler *this;
  error_handler *local_20;
  precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>_&,_char>
  local_18;
  
  local_20 = (error_handler *)(begin + 1);
  if (local_20 == (error_handler *)end) {
    iVar4 = 0;
  }
  else {
    iVar4 = (int)(char)*local_20;
  }
  if (iVar4 - 0x30U < 10) {
    this = (error_handler *)&local_20;
    iVar4 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                      ((char **)this,end,handler);
    ((handler->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = iVar4;
  }
  else {
    if (iVar4 != 0x7b) {
      error_handler::on_error((error_handler *)begin,"missing precision specifier");
    }
    this = (error_handler *)(begin + 2);
    local_20 = this;
    if (this != (error_handler *)end) {
      local_18.handler = handler;
      local_20 = (error_handler *)
                 parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&,char>>
                           ((char *)this,end,&local_18);
    }
    if ((local_20 == (error_handler *)end) ||
       (peVar1 = local_20 + 1, eVar2 = *local_20, local_20 = peVar1, eVar2 != (error_handler)0x7d))
    {
      error_handler::on_error(this,"invalid format string");
    }
  }
  tVar3 = (handler->checker_).arg_type_;
  if ((tVar3 < custom_type) && ((0x41feU >> (tVar3 & 0x1f) & 1) != 0)) {
    error_handler::on_error(this,"precision not allowed for this argument type");
  }
  return (char *)local_20;
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}